

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_debuglink.c
# Opt level: O0

void transform_to_posix_slash(dwarfstring *out,char *in)

{
  char cVar1;
  char *pcStack_20;
  int c;
  char *cp;
  char *in_local;
  dwarfstring *out_local;
  
  cVar1 = *in;
  pcStack_20 = in;
  while (cVar1 != '\0') {
    if (*pcStack_20 == joincharw) {
      dwarfstring_append_length(out,joinstr,1);
    }
    else {
      dwarfstring_append_length(out,pcStack_20,1);
    }
    pcStack_20 = pcStack_20 + 1;
    cVar1 = *pcStack_20;
  }
  return;
}

Assistant:

static void
transform_to_posix_slash(dwarfstring * out, char *in)
{
    char *cp = in;
    int c = 0;

    for (c = *cp ; c  ; ++cp,c = *cp) {
        if ( *cp == joincharw ) {
            dwarfstring_append_length(out,joinstr,1);
        } else {
            dwarfstring_append_length(out,cp,1);
        }
    }
}